

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void AddWindowToSortBuffer(ImVector<ImGuiWindow_*> *out_sorted_windows,ImGuiWindow *window)

{
  int *piVar1;
  int iVar2;
  ImGuiWindow **ppIVar3;
  ImGuiWindow *window_00;
  ImGuiWindow **__dest;
  int iVar4;
  int iVar5;
  size_t sVar6;
  size_t __nmemb;
  
  iVar2 = out_sorted_windows->Capacity;
  if (out_sorted_windows->Size == iVar2) {
    iVar5 = out_sorted_windows->Size + 1;
    if (iVar2 == 0) {
      iVar4 = 8;
    }
    else {
      iVar4 = iVar2 / 2 + iVar2;
    }
    if (iVar5 < iVar4) {
      iVar5 = iVar4;
    }
    if (iVar2 < iVar5) {
      if (GImGui != (ImGuiContext *)0x0) {
        piVar1 = &(GImGui->IO).MetricsActiveAllocations;
        *piVar1 = *piVar1 + 1;
      }
      __dest = (ImGuiWindow **)(*GImAllocatorAllocFunc)((long)iVar5 << 3,GImAllocatorUserData);
      if (out_sorted_windows->Data != (ImGuiWindow **)0x0) {
        memcpy(__dest,out_sorted_windows->Data,(long)out_sorted_windows->Size << 3);
        ppIVar3 = out_sorted_windows->Data;
        if ((ppIVar3 != (ImGuiWindow **)0x0) && (GImGui != (ImGuiContext *)0x0)) {
          piVar1 = &(GImGui->IO).MetricsActiveAllocations;
          *piVar1 = *piVar1 + -1;
        }
        (*GImAllocatorFreeFunc)(ppIVar3,GImAllocatorUserData);
      }
      out_sorted_windows->Data = __dest;
      out_sorted_windows->Capacity = iVar5;
    }
  }
  out_sorted_windows->Data[out_sorted_windows->Size] = window;
  out_sorted_windows->Size = out_sorted_windows->Size + 1;
  if (window->Active == true) {
    iVar2 = (window->DC).ChildWindows.Size;
    __nmemb = (size_t)iVar2;
    if (1 < (long)__nmemb) {
      qsort((window->DC).ChildWindows.Data,__nmemb,8,ChildWindowComparer);
    }
    if (0 < iVar2) {
      sVar6 = 0;
      do {
        if ((long)(window->DC).ChildWindows.Size <= (long)sVar6) {
          __assert_fail("i < Size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/JacquesLucke[P]gate_sim/extern/imgui/imgui.h"
                        ,0x52a,"T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]");
        }
        window_00 = (window->DC).ChildWindows.Data[sVar6];
        if (window_00->Active == true) {
          AddWindowToSortBuffer(out_sorted_windows,window_00);
        }
        sVar6 = sVar6 + 1;
      } while (__nmemb != sVar6);
    }
  }
  return;
}

Assistant:

static void AddWindowToSortBuffer(ImVector<ImGuiWindow*>* out_sorted_windows, ImGuiWindow* window)
{
    out_sorted_windows->push_back(window);
    if (window->Active)
    {
        int count = window->DC.ChildWindows.Size;
        if (count > 1)
            ImQsort(window->DC.ChildWindows.Data, (size_t)count, sizeof(ImGuiWindow*), ChildWindowComparer);
        for (int i = 0; i < count; i++)
        {
            ImGuiWindow* child = window->DC.ChildWindows[i];
            if (child->Active)
                AddWindowToSortBuffer(out_sorted_windows, child);
        }
    }
}